

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void absl::lts_20250127::str_format_internal::anon_unknown_0::FinalPrint
               (FormatState *state,string_view data,size_t padding_offset,size_t trailing_zeros,
               string_view data_postfix)

{
  char cVar1;
  FormatSinkImpl *pFVar2;
  string_view v;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  undefined1 local_68 [8];
  Padding padding;
  size_t trailing_zeros_local;
  size_t padding_offset_local;
  FormatState *state_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  state_local = (FormatState *)data._M_len;
  iVar3 = FormatConversionSpecImpl::width(state->conv);
  if (iVar3 < 0) {
    if (state->sign_char != '\0') {
      FormatSinkImpl::Append(state->sink,1,state->sign_char);
    }
    v._M_str = (char *)data_local._M_len;
    v._M_len = (size_t)state_local;
    FormatSinkImpl::Append(state->sink,v);
    FormatSinkImpl::Append(state->sink,trailing_zeros,'0');
    padding.right_spaces = data_postfix._M_len;
    FormatSinkImpl::Append(state->sink,data_postfix);
  }
  else {
    cVar1 = state->sign_char;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&state_local);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&data_postfix);
    ExtraWidthToPadding((Padding *)local_68,
                        (long)(int)(uint)(cVar1 != '\0') + sVar4 + sVar5 + trailing_zeros,state);
    FormatSinkImpl::Append(state->sink,(size_t)local_68,' ');
    if (state->sign_char != '\0') {
      FormatSinkImpl::Append(state->sink,1,state->sign_char);
    }
    pFVar2 = state->sink;
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&state_local,0,
                       padding_offset);
    FormatSinkImpl::Append(pFVar2,bVar6);
    FormatSinkImpl::Append(state->sink,padding.left_spaces,'0');
    pFVar2 = state->sink;
    bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)&state_local,
                       padding_offset,0xffffffffffffffff);
    FormatSinkImpl::Append(pFVar2,bVar6);
    FormatSinkImpl::Append(state->sink,trailing_zeros,'0');
    FormatSinkImpl::Append(state->sink,data_postfix);
    FormatSinkImpl::Append(state->sink,padding.zeros,' ');
  }
  return;
}

Assistant:

void FinalPrint(const FormatState& state,
                absl::string_view data,
                size_t padding_offset,
                size_t trailing_zeros,
                absl::string_view data_postfix) {
  if (state.conv.width() < 0) {
    // No width specified. Fast-path.
    if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
    state.sink->Append(data);
    state.sink->Append(trailing_zeros, '0');
    state.sink->Append(data_postfix);
    return;
  }

  auto padding =
      ExtraWidthToPadding((state.sign_char != '\0' ? 1 : 0) + data.size() +
                              data_postfix.size() + trailing_zeros,
                          state);

  state.sink->Append(padding.left_spaces, ' ');
  if (state.sign_char != '\0') state.sink->Append(1, state.sign_char);
  // Padding in general needs to be inserted somewhere in the middle of `data`.
  state.sink->Append(data.substr(0, padding_offset));
  state.sink->Append(padding.zeros, '0');
  state.sink->Append(data.substr(padding_offset));
  state.sink->Append(trailing_zeros, '0');
  state.sink->Append(data_postfix);
  state.sink->Append(padding.right_spaces, ' ');
}